

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O1

TPZCompEl * TPZPostProcAnalysis::CreateQuadEl(TPZGeoEl *gel,TPZCompMesh *mesh)

{
  TPZCompElH1<pzshape::TPZShapeQuad> *this;
  
  if ((gel->fReference == (TPZCompEl *)0x0) && (gel->fNumInterfaces == 0)) {
    this = (TPZCompElH1<pzshape::TPZShapeQuad> *)operator_new(200);
    *(undefined ***)
     &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
      super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0199e2f0;
    TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1(this,&PTR_PTR_01998d20,mesh,gel,EH1Standard);
    *(undefined8 *)
     &this[1].super_TPZIntelGen<pzshape::TPZShapeQuad>.super_TPZInterpolatedElement.
      super_TPZInterpolationSpace.super_TPZCompEl = 0;
    *(undefined ***)
     &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
      super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElPostProc_01998950;
  }
  else {
    this = (TPZCompElH1<pzshape::TPZShapeQuad> *)0x0;
  }
  return (TPZCompEl *)this;
}

Assistant:

TPZCompEl *TPZPostProcAnalysis::CreateQuadEl(TPZGeoEl *gel,TPZCompMesh &mesh) {
	if(!gel->Reference() && gel->NumInterfaces() == 0)
		return new TPZCompElPostProc<TPZCompElH1<TPZShapeQuad> >(mesh,gel);
	return NULL;
}